

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_dist_graph_neighbors_count_
               (MPIABI_Fint *comm,int *indegree,int *outdegree,int *weighted,MPIABI_Fint *ierror)

{
  mpi_dist_graph_neighbors_count_();
  return;
}

Assistant:

void mpiabi_dist_graph_neighbors_count_(
  const MPIABI_Fint * comm,
  int * indegree,
  int * outdegree,
  int * weighted,
  MPIABI_Fint * ierror
) {
  return mpi_dist_graph_neighbors_count_(
    comm,
    indegree,
    outdegree,
    weighted,
    ierror
  );
}